

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

int Fl_X::xrender_supported(void)

{
  undefined1 local_10 [4];
  undefined1 local_c [4];
  int nop2;
  int nop1;
  
  if (xrender_supported::result == -1) {
    fl_open_display();
    xrender_supported::result = XRenderQueryExtension(fl_display,local_c,local_10);
  }
  return xrender_supported::result;
}

Assistant:

int Fl_X::xrender_supported() {
#if HAVE_XRENDER
  static int result = -1;

  if (result == -1) {
    fl_open_display();

    int nop1, nop2;
    result = XRenderQueryExtension(fl_display, &nop1, &nop2);
  }

  return result;
#else
  return 0;
#endif
}